

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O1

LispPTR CHAR_bouts(LispPTR *args)

{
  DLword *pDVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  ssize_t sVar5;
  uint uVar6;
  uint uVar7;
  void *page;
  
  uVar6 = args[4];
  if ((uVar6 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
  }
  Lisp_errno = (int *)(Lisp_world + uVar6);
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    uVar6 = *args;
    if ((uVar6 & 0xfff0000) == 0xf0000) {
      uVar6 = uVar6 | 0xffff0000;
    }
    else if ((uVar6 & 0xfff0000) == 0xe0000) {
      uVar6 = uVar6 & 0xffff;
    }
    else {
      if ((uVar6 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
      }
      uVar6 = *(uint *)(Lisp_world + uVar6);
    }
    pDVar1 = Lisp_world;
    uVar3 = args[1];
    uVar7 = args[2];
    if ((uVar7 & 0xfff0000) == 0xf0000) {
      uVar7 = uVar7 | 0xffff0000;
    }
    else if ((uVar7 & 0xfff0000) == 0xe0000) {
      uVar7 = uVar7 & 0xffff;
    }
    else {
      if ((uVar7 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar7);
      }
      uVar7 = *(uint *)(Lisp_world + uVar7);
    }
    page = (void *)((long)pDVar1 + (ulong)uVar7 + (ulong)uVar3 * 2);
    uVar3 = args[3];
    if ((uVar3 & 0xfff0000) == 0xf0000) {
      uVar3 = uVar3 | 0xffff0000;
    }
    else if ((uVar3 & 0xfff0000) == 0xe0000) {
      uVar3 = uVar3 & 0xffff;
    }
    else {
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
      }
      uVar3 = *(uint *)(Lisp_world + uVar3);
    }
    uVar7 = (int)(uVar3 + 3) >> 2;
    word_swap_page(page,uVar7);
    alarm(TIMEOUT_TIME);
    piVar4 = __errno_location();
    do {
      *piVar4 = 0;
      sVar5 = write(uVar6,page,(long)(int)uVar3);
      if (sVar5 != -1) {
        alarm(0);
        word_swap_page(page,uVar7);
        if (sVar5 == 0) {
          *Lisp_errno = 0xb;
          return 0;
        }
        if (sVar5 < 0) {
          if (-0x10001 < sVar5) {
            return (uint)sVar5 & 0xffff | 0xf0000;
          }
        }
        else if (sVar5 < 0x10000) {
          return (uint)sVar5 | 0xe0000;
        }
        error("Not Smallp data");
        return 0xe0000;
      }
    } while (*piVar4 == 4);
    alarm(0);
    word_swap_page(page,uVar7);
    *Lisp_errno = *piVar4;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR CHAR_bouts(LispPTR *args)
{
#ifndef DOS
  int fd;
  ssize_t rval;
  char *buffer;
  int nbytes;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);
  ERRSETJMP(NIL);
  fd = LispNumToCInt(args[0]);
  buffer = ((char *)(NativeAligned2FromLAddr(args[1]))) + LispNumToCInt(args[2]);
  nbytes = LispNumToCInt(args[3]);
/* Write PAGE_SIZE bytes file contents from filepointer. */
#ifdef BYTESWAP
  word_swap_page((unsigned short *)buffer, (nbytes + 3) >> 2);
#endif /* BYTESWAP */

  TIMEOUT(rval = write(fd, buffer, nbytes));
#ifdef BYTESWAP
  word_swap_page((unsigned short *)buffer, (nbytes + 3) >> 2);
#endif /* BYTESWAP */

  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  if (rval == 0) {
    *Lisp_errno = EWOULDBLOCK;
    return (NIL);
  }
  return (GetSmallp(rval));
#endif /* DOS */
}